

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O2

bool __thiscall ELFIO::elfio::save(elfio *this,ostream *stream)

{
  elf_header *peVar1;
  elfio *peVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  undefined8 in_RAX;
  ulong local_28;
  
  if ((((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 5) == 0) &&
     (peVar1 = (this->header)._M_t.
               super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>.
               _M_t.
               super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
               super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl,
     peVar1 != (elf_header *)0x0)) {
    peVar2 = (this->segments).parent;
    local_28._2_6_ = (undefined6)((ulong)in_RAX >> 0x10);
    local_28 = CONCAT62(local_28._2_6_,
                        (short)((uint)(*(int *)&(peVar2->segments_).
                                                super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                      *(int *)&(peVar2->segments_).
                                               super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 3));
    (*peVar1->_vptr_elf_header[0x1d])();
    peVar1 = (this->header)._M_t.
             super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
             super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
             super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl;
    peVar2 = (this->segments).parent;
    if ((*(int *)&(peVar2->segments_).
                  super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
         *(int *)&(peVar2->segments_).
                  super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start & 0x7fff8U) == 0) {
      local_28 = 0;
    }
    else {
      uVar4 = (*peVar1->_vptr_elf_header[7])(peVar1);
      local_28 = (ulong)(uVar4 & 0xffff);
    }
    (*peVar1->_vptr_elf_header[0x1f])(peVar1,&local_28);
    peVar2 = (this->sections).parent;
    peVar1 = (this->header)._M_t.
             super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
             super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
             super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl;
    local_28 = CONCAT62(local_28._2_6_,
                        (short)((uint)(*(int *)&(peVar2->sections_).
                                                super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                      *(int *)&(peVar2->sections_).
                                               super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 3));
    (*peVar1->_vptr_elf_header[0x19])(peVar1,&local_28);
    peVar1 = (this->header)._M_t.
             super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
             super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
             super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl;
    local_28 = 0;
    (*peVar1->_vptr_elf_header[0x1b])(peVar1,&local_28);
    uVar4 = (*((this->header)._M_t.
               super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>.
               _M_t.
               super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
               super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl)->_vptr_elf_header[7])
                      ();
    uVar5 = (*((this->header)._M_t.
               super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>.
               _M_t.
               super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
               super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl)->_vptr_elf_header[9])
                      ();
    uVar6 = (*((this->header)._M_t.
               super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>.
               _M_t.
               super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
               super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl)->_vptr_elf_header
              [0x1c])();
    this->current_file_pos =
         (ulong)(uVar6 & 0xffff) * (ulong)(uVar5 & 0xffff) + (ulong)(uVar4 & 0xffff);
    calc_segment_alignment(this);
    bVar3 = layout_segments_and_their_sections(this);
    if ((((bVar3) && (bVar3 = layout_sections_without_segments(this), bVar3)) &&
        (bVar3 = layout_section_table(this), bVar3)) &&
       ((peVar1 = (this->header)._M_t.
                  super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>
                  .super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl,
        iVar7 = (*peVar1->_vptr_elf_header[3])(peVar1,stream), (char)iVar7 != '\0' &&
        (bVar3 = save_sections(this,stream), bVar3)))) {
      bVar3 = save_segments(this,stream);
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool save( std::ostream& stream )
    {
        if ( !stream || header == nullptr ) {
            return false;
        }

        // Define layout specific header fields
        // The position of the segment table is fixed after the header.
        // The position of the section table is variable and needs to be fixed
        // before saving.
        header->set_segments_num( segments.size() );
        header->set_segments_offset(
            segments.size() > 0 ? header->get_header_size() : 0 );
        header->set_sections_num( sections.size() );
        header->set_sections_offset( 0 );

        // Layout the first section right after the segment table
        current_file_pos =
            header->get_header_size() +
            header->get_segment_entry_size() *
                static_cast<Elf_Xword>( header->get_segments_num() );

        calc_segment_alignment();

        bool is_still_good = layout_segments_and_their_sections();
        is_still_good = is_still_good && layout_sections_without_segments();
        is_still_good = is_still_good && layout_section_table();

        is_still_good = is_still_good && save_header( stream );
        is_still_good = is_still_good && save_sections( stream );
        is_still_good = is_still_good && save_segments( stream );

        return is_still_good;
    }